

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

void Abc_WriteKLut(FILE *pFile,int nLutSize)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  char *__format;
  uint uVar8;
  uint uVar9;
  
  bVar1 = (byte)nLutSize & 0x1f;
  uVar8 = 1 << bVar1;
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,".model lut%d\n",nLutSize);
  fwrite(".inputs",7,1,(FILE *)pFile);
  uVar4 = 0;
  if (0 < 1 << bVar1) {
    uVar4 = uVar8;
  }
  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    fprintf((FILE *)pFile," p%02d",(ulong)uVar6);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".inputs",7,1,(FILE *)pFile);
  uVar4 = 0;
  if (0 < nLutSize) {
    uVar4 = nLutSize;
  }
  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    fprintf((FILE *)pFile," i%d",(ulong)uVar6);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".outputs o\n",0xb,1,(FILE *)pFile);
  fwrite(".names n01 o\n",0xd,1,(FILE *)pFile);
  fwrite("1 1\n",4,1,(FILE *)pFile);
  uVar9 = ((int)uVar8 / -2) * 2 + 3;
  uVar4 = 2;
  uVar6 = 3;
  uVar5 = 0;
  for (uVar7 = 1; (int)uVar7 < (int)uVar8; uVar7 = uVar7 + 1) {
    uVar5 = uVar5 + (uVar7 == uVar4);
    uVar4 = uVar4 << (uVar7 == uVar4);
    if (uVar5 == nLutSize - 1U) {
      __format = ".names i%d p%02d p%02d n%02d\n";
      uVar2 = nLutSize - 1U;
      uVar3 = uVar9;
    }
    else {
      __format = ".names i%d n%02d n%02d n%02d\n";
      uVar2 = uVar5;
      uVar3 = uVar6;
    }
    fprintf((FILE *)pFile,__format,(ulong)uVar2,(ulong)(uVar3 - 1),(ulong)uVar3,(ulong)uVar7);
    fwrite("01- 1\n",6,1,(FILE *)pFile);
    fwrite("1-1 1\n",6,1,(FILE *)pFile);
    uVar9 = uVar9 + 2;
    uVar6 = uVar6 + 2;
  }
  fwrite(".end\n",5,1,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Abc_WriteKLut( FILE * pFile, int nLutSize )
{
    int i, iVar, iNext, nPars = (1 << nLutSize);
    fprintf( pFile, "\n" ); 
    fprintf( pFile, ".model lut%d\n", nLutSize );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nPars; i++ )
        fprintf( pFile, " p%02d", i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nLutSize; i++ )
        fprintf( pFile, " i%d", i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs o\n" ); 
    fprintf( pFile, ".names n01 o\n" ); 
    fprintf( pFile, "1 1\n" ); 
    // write internal MUXes
    iVar = 0;
    iNext = 2;
    for ( i = 1; i < nPars; i++ )
    {
        if ( i == iNext )
        {
            iNext *= 2;
            iVar++; 
        }
        if ( iVar == nLutSize - 1 )
            fprintf( pFile, ".names i%d p%02d p%02d n%02d\n", iVar, 2*(i-nPars/2), 2*(i-nPars/2)+1, i ); 
        else
            fprintf( pFile, ".names i%d n%02d n%02d n%02d\n", iVar, 2*i, 2*i+1, i ); 
        fprintf( pFile, "01- 1\n" ); 
        fprintf( pFile, "1-1 1\n" ); 
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
}